

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarIntG8IU.h
# Opt level: O2

uint32_t * __thiscall
FastPForLib::VarIntG8IU::decodeArray
          (VarIntG8IU *this,uint32_t *in,size_t length,uint32_t *out,size_t *nvalue)

{
  byte bVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 (*__dest) [16];
  char buff [32];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  uVar6 = (long)in + 3;
  __dest = (undefined1 (*) [16])out;
  for (uVar7 = length << 2; 0x15 < uVar7; uVar7 = uVar7 - 9) {
    bVar1 = (byte)*in;
    auVar3 = vlddqu_avx(*(undefined1 (*) [16])((long)in + 1));
    auVar4 = vpshufb_avx(auVar3,(undefined1  [16])this->vecmask[bVar1][0]);
    *__dest = auVar4;
    iVar2 = this->maskOutputSize[bVar1];
    if (4 < (long)iVar2) {
      auVar3 = vpshufb_avx(auVar3,(undefined1  [16])this->vecmask[bVar1][1]);
      __dest[1] = auVar3;
    }
    __dest = (undefined1 (*) [16])(*__dest + (long)iVar2 * 4);
    in = (uint32_t *)((long)in + 9);
    uVar6 = uVar6 + 9;
  }
  for (; 8 < uVar7; uVar7 = uVar7 - 9) {
    bVar1 = (byte)*in;
    local_58._0_8_ = *(undefined8 *)((long)in + 1);
    auVar3 = vlddqu_avx(local_58);
    local_58 = vpshufb_avx(auVar3,(undefined1  [16])this->vecmask[bVar1][0]);
    lVar5 = (long)this->maskOutputSize[bVar1];
    if (4 < lVar5) {
      local_48 = vpshufb_avx(auVar3,(undefined1  [16])this->vecmask[bVar1][1]);
    }
    memcpy(__dest,local_58,lVar5 * 4);
    __dest = (undefined1 (*) [16])(*__dest + lVar5 * 4);
    in = (uint32_t *)((long)in + 9);
    uVar6 = uVar6 + 9;
  }
  *nvalue = (long)__dest - (long)out >> 2;
  return (uint32_t *)(uVar6 & 0xfffffffffffffffc);
}

Assistant:

const uint32_t *decodeArray(const uint32_t *in, const size_t length,
                              uint32_t *out, size_t &nvalue) {

    const unsigned char *src = reinterpret_cast<const unsigned char *>(in);
    const uint32_t *const initdst = out;

    uint32_t *dst = out;
    size_t srclength = length * 4;
    for (; srclength >= 22; srclength -= 8, src += 8) {
      unsigned char desc = *src;
      src += 1;
      srclength -= 1;
      const __m128i data =
          _mm_lddqu_si128(reinterpret_cast<__m128i const *>(src));
      const __m128i result = _mm_shuffle_epi8(data, vecmask[desc][0]);
      _mm_storeu_si128(reinterpret_cast<__m128i *>(dst), result);
      int readSize = maskOutputSize[desc];

      if (readSize > 4) {
        const __m128i result2 = _mm_shuffle_epi8(
            data, vecmask[desc][1]); //__builtin_ia32_pshufb128(data, shf2);
        _mm_storeu_si128(
            reinterpret_cast<__m128i *>(dst + 4),
            result2); //__builtin_ia32_storedqu(dst + (16), result2);
      }
      dst += readSize;
    }
    while (srclength >= 9) {
      unsigned char desc = *src;
      src += 1;
      srclength -= 1;
      char buff[32];
      memcpy(buff, src, 8);
      const __m128i data =
          _mm_lddqu_si128(reinterpret_cast<__m128i const *>(buff));
      const __m128i result = _mm_shuffle_epi8(data, vecmask[desc][0]);
      _mm_storeu_si128(reinterpret_cast<__m128i *>(buff), result);
      int readSize = maskOutputSize[desc];
      if (readSize > 4) {
        const __m128i result2 = _mm_shuffle_epi8(data, vecmask[desc][1]);
        _mm_storeu_si128(reinterpret_cast<__m128i *>(buff + 16), result2);
      }
      memcpy(dst, buff, 4 * readSize);
      dst += readSize;
      srclength -= 8;
      src += 8;
    }

    nvalue = (dst - initdst);
    return reinterpret_cast<uint32_t *>((reinterpret_cast<uintptr_t>(src) + 3) &
                                        ~3);
  }